

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

string * cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                   (string *__return_storage_ptr__,
                   vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *r,char *delimiter)

{
  pointer __result;
  ostringstream os;
  undefined1 auStack_1b8 [16];
  ostringstream *local_1a8;
  char *local_1a0;
  ostream local_198;
  
  if ((r->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (r->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    __result = (r->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1;
    local_1a8 = (ostringstream *)&local_198;
    local_1a0 = delimiter;
    std::
    copy<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>,std::ostream_iterator<cmLinkImplItem,char,std::char_traits<char>>>
              ((cmLinkImplItem *)auStack_1b8,
               (r->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (ostream_iterator<cmLinkImplItem,_char,_std::char_traits<char>_> *)__result);
    std::operator<<(&local_198,(string *)__result);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& r, const char* delimiter)
{
  if (r.empty())
    {
    return std::string();
    }
  std::ostringstream os;
  typedef typename Range::value_type ValueType;
  typedef typename Range::const_iterator InputIt;
  const InputIt first = r.begin();
  InputIt last = r.end();
  --last;
  std::copy(first, last,
      std::ostream_iterator<ValueType>(os, delimiter));

  os << *last;

  return os.str();
}